

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::refine(btSoftBody *this,ImplicitFn *ifn,btScalar accurary,bool cut)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint n;
  btScalar bVar4;
  btScalar bVar5;
  Face *pFVar6;
  Node *pNVar7;
  int iVar8;
  btScalar bVar9;
  ulong uVar10;
  btVector3 bVar11;
  bool bVar12;
  int iVar13;
  Node **ppNVar14;
  int *piVar15;
  Node *pNVar16;
  long lVar17;
  long lVar18;
  undefined7 in_register_00000011;
  uint uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  Link *pLVar24;
  btVector3 *pbVar25;
  int iVar26;
  Link *pLVar27;
  Link *pLVar28;
  Link *pLVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  size_t sVar35;
  bool bVar36;
  byte bVar37;
  float fVar38;
  float fVar39;
  btScalar bVar40;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar42;
  undefined1 auVar41 [16];
  float fVar43;
  float fVar44;
  btAlignedObjectArray<int> cnodes;
  btAlignedObjectArray<int> ranks;
  btVector3 x;
  btSymMatrix<int> edges;
  btAlignedObjectArray<int> todelete;
  float local_1b4;
  btAlignedObjectArray<int> local_188;
  btScalar local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined4 local_14c;
  btAlignedObjectArray<int> local_148;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong local_118;
  long local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f0;
  btVector3 local_e8 [4];
  btScalar local_a8;
  btSymMatrix<int> local_a0;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  btAlignedObjectArray<int> local_68;
  btScalar local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  bVar37 = 0;
  local_14c = (undefined4)CONCAT71(in_register_00000011,cut);
  pNVar16 = (this->m_nodes).m_data;
  n = (this->m_nodes).m_size;
  uVar34 = (ulong)n;
  local_e8[0].m_floats[0] = -NAN;
  local_168 = accurary;
  uStack_164 = in_XMM0_Db;
  uStack_160 = in_XMM0_Dc;
  uStack_15c = in_XMM0_Dd;
  btSymMatrix<int>::btSymMatrix(&local_a0,n,(int *)local_e8);
  iVar13 = (this->m_links).m_size;
  if (0 < iVar13) {
    iVar21 = 0;
    do {
      pLVar27 = (this->m_links).m_data;
      if ((pLVar27[iVar21].field_0x24 & 1) != 0) {
        fVar38 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn,&pLVar27[iVar21].m_n[0]->m_x);
        fVar39 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn);
        iVar13 = (this->m_links).m_size;
        if (fVar38 * fVar39 <= 0.0) {
          pLVar29 = (this->m_links).m_data;
          pLVar27 = pLVar29 + iVar21;
          pLVar24 = pLVar27;
          pbVar25 = local_e8;
          for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
            *(void **)pbVar25->m_floats = (pLVar24->super_Feature).super_Element.m_tag;
            pLVar24 = (Link *)((long)pLVar24 + (ulong)bVar37 * -0x10 + 8);
            pbVar25 = (btVector3 *)((long)(pbVar25 + -(ulong)bVar37) + 8);
          }
          pLVar24 = pLVar29 + (long)iVar13 + -1;
          pLVar28 = pLVar27;
          for (lVar17 = 8; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pLVar28->super_Feature).super_Element.m_tag =
                 (pLVar24->super_Feature).super_Element.m_tag;
            pLVar24 = (Link *)((long)pLVar24 + (ulong)bVar37 * -0x10 + 8);
            pLVar28 = (Link *)((long)pLVar28 + (ulong)bVar37 * -0x10 + 8);
          }
          (pLVar27->m_c3).m_floats[3] = pLVar29[(long)iVar13 + -1].m_c3.m_floats[3];
          pbVar25 = local_e8;
          pLVar27 = pLVar29 + (long)iVar13 + -1;
          for (lVar17 = 8; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pLVar27->super_Feature).super_Element.m_tag = *(void **)pbVar25->m_floats;
            pbVar25 = (btVector3 *)((long)(pbVar25 + -(ulong)bVar37) + 8);
            pLVar27 = (Link *)((long)pLVar27 + (ulong)bVar37 * -0x10 + 8);
          }
          pLVar29[(long)iVar13 + -1].m_c3.m_floats[3] = local_a8;
          iVar13 = (this->m_links).m_size + -1;
          (this->m_links).m_size = iVar13;
          iVar21 = iVar21 + -1;
        }
      }
      iVar21 = iVar21 + 1;
    } while (iVar21 < iVar13);
    if (0 < iVar13) {
      ppNVar14 = ((this->m_links).m_data)->m_n + 1;
      lVar17 = 0;
      do {
        iVar23 = (int)((ulong)((long)ppNVar14[-1] - (long)pNVar16) >> 3) * -0x11111111;
        iVar13 = (int)((ulong)((long)*ppNVar14 - (long)pNVar16) >> 3);
        iVar21 = iVar13 * -0x11111111;
        bVar36 = iVar23 + iVar13 * 0x11111111 < 0;
        iVar13 = iVar21;
        if (SBORROW4(iVar23,iVar21) != bVar36) {
          iVar13 = iVar23;
        }
        if (iVar23 != iVar21 && SBORROW4(iVar23,iVar21) == bVar36) {
          iVar21 = iVar23;
        }
        local_a0.store.m_data[((iVar21 + 1) * iVar21) / 2 + iVar13] = -1;
        lVar17 = lVar17 + 1;
        ppNVar14 = ppNVar14 + 9;
      } while (lVar17 < (this->m_links).m_size);
    }
  }
  if (0 < (this->m_faces).m_size) {
    ppNVar14 = ((this->m_faces).m_data)->m_n + 2;
    lVar17 = 0;
    do {
      iVar26 = (int)((ulong)((long)ppNVar14[-2] - (long)pNVar16) >> 3);
      iVar23 = iVar26 * -0x11111111;
      iVar13 = (int)((ulong)((long)ppNVar14[-1] - (long)pNVar16) >> 3);
      iVar21 = iVar13 * -0x11111111;
      bVar36 = iVar23 + iVar13 * 0x11111111 < 0;
      iVar13 = iVar21;
      if (SBORROW4(iVar23,iVar21) != bVar36) {
        iVar13 = iVar23;
      }
      iVar30 = iVar21;
      if (iVar23 != iVar21 && SBORROW4(iVar23,iVar21) == bVar36) {
        iVar30 = iVar23;
      }
      local_a0.store.m_data[((iVar30 + 1) * iVar30) / 2 + iVar13] = -1;
      iVar13 = (int)((ulong)((long)*ppNVar14 - (long)pNVar16) >> 3);
      iVar30 = iVar13 * -0x11111111;
      bVar36 = iVar21 + iVar13 * 0x11111111 < 0;
      iVar13 = iVar30;
      if (SBORROW4(iVar21,iVar30) != bVar36) {
        iVar13 = iVar21;
      }
      if (iVar21 == iVar30 || SBORROW4(iVar21,iVar30) != bVar36) {
        iVar21 = iVar30;
      }
      iVar26 = iVar30 + iVar26 * 0x11111111;
      iVar8 = iVar23;
      if (iVar30 < iVar23) {
        iVar8 = iVar30;
      }
      local_a0.store.m_data[((iVar21 + 1) * iVar21) / 2 + iVar13] = -1;
      if (iVar26 != 0 && SBORROW4(iVar30,iVar23) == iVar26 < 0) {
        iVar23 = iVar30;
      }
      local_a0.store.m_data[((iVar23 + 1) * iVar23) / 2 + iVar8] = -1;
      lVar17 = lVar17 + 1;
      ppNVar14 = ppNVar14 + 9;
    } while (lVar17 < (this->m_faces).m_size);
  }
  if (0 < (int)n) {
    local_48 = -local_168;
    uStack_44 = uStack_164 ^ 0x80000000;
    uStack_40 = uStack_160 ^ 0x80000000;
    uStack_3c = uStack_15c ^ 0x80000000;
    local_118 = 1;
    uVar22 = 0;
    do {
      local_f0 = uVar22 + 1;
      if (local_f0 < uVar34) {
        local_110 = uVar22 * 0x78;
        uVar32 = local_118;
        do {
          iVar21 = (int)uVar22;
          iVar23 = (int)uVar32;
          iVar13 = iVar23;
          if (iVar21 < iVar23) {
            iVar13 = iVar21;
          }
          uVar10 = uVar32;
          if (iVar23 < iVar21) {
            uVar10 = uVar22;
          }
          uVar19 = ((uint)(((int)uVar10 + 1) * (int)uVar10) >> 1) + iVar13;
          if (local_a0.store.m_data[uVar19] == -1) {
            pNVar16 = (this->m_nodes).m_data;
            fVar38 = (float)(**(code **)(*(long *)ifn + 0x10))
                                      (ifn,(long)(pNVar16->m_x).m_floats + local_110);
            fVar39 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn);
            lVar17 = local_110;
            uVar10 = local_128;
            local_128 = local_128 & 0xffffffff00000000;
            if (fVar38 <= fVar39) {
              local_1b4 = 1.0;
              fVar42 = fVar39;
            }
            else {
              local_1b4 = 0.0;
              local_128._4_4_ = SUB84(uVar10,4);
              local_128 = CONCAT44(local_128._4_4_,0x3f800000);
              fVar42 = fVar38;
              fVar38 = fVar39;
            }
            if ((local_168 <= fVar42) && (fVar38 <= local_48)) {
              iVar13 = 0x100;
              do {
                local_108 = CONCAT44(local_108._4_4_,fVar42);
                fVar44 = (local_1b4 - (float)local_128) * (fVar38 / (fVar38 - fVar42)) +
                         (float)local_128;
                fVar39 = *(float *)((long)(pNVar16->m_x).m_floats + lVar17 + 8);
                uVar2 = *(undefined8 *)pNVar16[uVar32].m_x.m_floats;
                uVar3 = *(undefined8 *)((long)(pNVar16->m_x).m_floats + lVar17);
                fVar42 = (float)uVar3;
                fVar43 = (float)((ulong)uVar3 >> 0x20);
                local_e8[0].m_floats[1] = ((float)((ulong)uVar2 >> 0x20) - fVar43) * fVar44 + fVar43
                ;
                local_e8[0].m_floats[0] = ((float)uVar2 - fVar42) * fVar44 + fVar42;
                local_e8[0].m_floats[2] =
                     (pNVar16[uVar32].m_x.m_floats[2] - fVar39) * fVar44 + fVar39;
                local_e8[0].m_floats[3] = 0.0;
                local_78 = fVar44;
                fStack_74 = fVar44;
                fStack_70 = fVar44;
                fStack_6c = fVar44;
                fVar39 = (float)(**(code **)(*(long *)ifn + 0x10))();
                if ((fVar44 <= 0.0) || (1.0 <= fVar44)) break;
                if (ABS(fVar39) < local_168) {
                  if (0.0 < fVar44) {
                    fVar38 = *(float *)((long)(pNVar16->m_x).m_floats + lVar17 + 8);
                    uVar2 = *(undefined8 *)pNVar16[uVar32].m_x.m_floats;
                    uVar3 = *(undefined8 *)((long)(pNVar16->m_x).m_floats + lVar17);
                    fVar39 = (float)uVar3;
                    fVar42 = (float)((ulong)uVar3 >> 0x20);
                    local_e8[0].m_floats[0] = ((float)uVar2 - fVar39) * local_78 + fVar39;
                    local_e8[0].m_floats[1] =
                         ((float)((ulong)uVar2 >> 0x20) - fVar42) * fStack_74 + fVar42;
                    local_e8[0].m_floats[2] =
                         (pNVar16[uVar32].m_x.m_floats[2] - fVar38) * fVar44 + fVar38;
                    local_e8[0].m_floats[3] = 0.0;
                    fVar38 = *(float *)((long)(&pNVar16->m_n + 1) + lVar17);
                    fVar39 = pNVar16[uVar32].m_im;
                    if (fVar38 <= 0.0) {
                      bVar40 = 0.0;
                      if (0.0 < fVar39) {
                        pNVar16[uVar32].m_im = fVar39 + fVar39;
                        bVar40 = 1.0 / (fVar39 + fVar39);
                      }
                    }
                    else if (fVar39 <= 0.0) {
                      *(float *)((long)(&pNVar16->m_n + 1) + lVar17) = fVar38 + fVar38;
                      bVar40 = 1.0 / (fVar38 + fVar38);
                    }
                    else {
                      auVar41._4_4_ = fVar38;
                      auVar41._0_4_ = fVar39;
                      auVar41._8_8_ = 0;
                      auVar41 = divps(_DAT_001ee3f0,auVar41);
                      fVar39 = auVar41._0_4_;
                      fVar42 = auVar41._4_4_;
                      fVar43 = (fVar39 - fVar42) * fVar44 + fVar42;
                      fVar38 = (fVar42 + fVar39) / (fVar42 + fVar39 + fVar43);
                      *(float *)((long)(&pNVar16->m_n + 1) + lVar17) = 1.0 / (fVar42 * fVar38);
                      pNVar16[uVar32].m_im = 1.0 / (fVar39 * fVar38);
                      bVar40 = fVar38 * fVar43;
                    }
                    fVar38 = pNVar16[uVar32].m_v.m_floats[2];
                    fVar39 = *(float *)((long)(pNVar16->m_v).m_floats + lVar17 + 8);
                    local_128 = *(ulong *)pNVar16[uVar32].m_v.m_floats;
                    uStack_120 = 0;
                    local_108 = *(undefined8 *)((long)(pNVar16->m_v).m_floats + lVar17);
                    uStack_100 = 0;
                    appendNode(this,local_e8,bVar40);
                    iVar13 = (this->m_nodes).m_size;
                    local_a0.store.m_data[uVar19] = iVar13 + -1;
                    pbVar25 = &(this->m_nodes).m_data[(long)iVar13 + -1].m_v;
                    pbVar25->m_floats[0] =
                         local_78 * ((float)local_128 - (float)local_108) + (float)local_108;
                    pbVar25->m_floats[1] =
                         fStack_74 * (local_128._4_4_ - local_108._4_4_) + local_108._4_4_;
                    pbVar25->m_floats[2] = fVar44 * (fVar38 - fVar39) + fVar39;
                    pbVar25->m_floats[3] = 0.0;
                  }
                  break;
                }
                fVar42 = fVar39;
                if (fVar39 < 0.0) {
                  local_128 = CONCAT44(local_128._4_4_,fVar44);
                  fVar42 = (float)local_108;
                  fVar38 = fVar39;
                  fVar44 = local_1b4;
                }
                local_1b4 = fVar44;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar34);
      }
      local_118 = local_118 + 1;
      uVar22 = local_f0;
    } while (local_f0 != uVar34);
  }
  pNVar16 = (this->m_nodes).m_data;
  lVar17 = (long)(this->m_links).m_size;
  if (0 < lVar17) {
    lVar33 = 0x18;
    lVar31 = 0;
    do {
      pLVar27 = (this->m_links).m_data;
      iVar13 = (int)(*(long *)((long)pLVar27->m_n + lVar33 + -0x18) - (long)pNVar16 >> 3) *
               -0x11111111;
      if ((iVar13 < (int)n) &&
         (iVar21 = (int)(*(long *)((long)pLVar27->m_n + lVar33 + -0x10) - (long)pNVar16 >> 3) *
                   -0x11111111, iVar21 < (int)n)) {
        iVar23 = iVar21;
        if (iVar13 < iVar21) {
          iVar23 = iVar13;
        }
        iVar26 = iVar21;
        if (iVar21 < iVar13) {
          iVar26 = iVar13;
        }
        lVar20 = (long)local_a0.store.m_data[((iVar26 + 1) * iVar26) / 2 + iVar23];
        if (0 < lVar20) {
          appendLink(this,(int)lVar31,(Material *)0x0);
          pLVar27 = (this->m_links).m_data;
          lVar18 = (long)(this->m_links).m_size;
          *(Node **)((long)pLVar27->m_n + lVar33 + -0x18) = (this->m_nodes).m_data + iVar13;
          *(Node **)((long)pLVar27->m_n + lVar33 + -0x10) = (this->m_nodes).m_data + lVar20;
          pLVar27[lVar18 + -1].m_n[0] = (this->m_nodes).m_data + lVar20;
          pLVar27[lVar18 + -1].m_n[1] = (this->m_nodes).m_data + iVar21;
        }
      }
      lVar31 = lVar31 + 1;
      lVar33 = lVar33 + 0x48;
    } while (lVar17 != lVar31);
  }
  iVar13 = (this->m_faces).m_size;
  if (0 < iVar13) {
    iVar21 = 0;
    do {
      bVar11.m_floats = local_e8[0].m_floats;
      pFVar6 = (this->m_faces).m_data;
      local_e8[0].m_floats[1] =
           (btScalar)
           ((int)((ulong)((long)pFVar6[iVar21].m_n[1] - (long)pNVar16) >> 3) * -0x11111111);
      local_e8[0].m_floats[0] =
           (btScalar)
           ((int)((ulong)((long)pFVar6[iVar21].m_n[0] - (long)pNVar16) >> 3) * -0x11111111);
      local_e8[0].m_floats[3] = bVar11.m_floats[3];
      local_e8[0].m_floats[2] =
           (btScalar)
           ((int)((ulong)((long)pFVar6[iVar21].m_n[2] - (long)pNVar16) >> 3) * -0x11111111);
      uVar34 = 0;
      uVar22 = 2;
      do {
        uVar32 = uVar34;
        bVar40 = local_e8[0].m_floats[uVar22 & 0xffffffff];
        if ((int)bVar40 < (int)n) {
          bVar4 = local_e8[0].m_floats[uVar32];
          if ((int)bVar4 < (int)n) {
            bVar5 = bVar4;
            if ((int)bVar40 < (int)bVar4) {
              bVar5 = bVar40;
            }
            bVar9 = bVar4;
            if ((int)bVar4 < (int)bVar40) {
              bVar9 = bVar40;
            }
            lVar17 = (long)local_a0.store.m_data[(((int)bVar9 + 1) * (int)bVar9) / 2 + (int)bVar5];
            if (0 < lVar17) {
              appendFace(this,iVar21,(Material *)0x0);
              pFVar6 = (this->m_faces).m_data;
              lVar33 = (long)(this->m_faces).m_size;
              lVar31 = 0;
              if (uVar32 != 2) {
                lVar31 = uVar32 + 1;
              }
              bVar5 = local_e8[0].m_floats[lVar31];
              pFVar6[iVar21].m_n[0] = (this->m_nodes).m_data + (int)bVar5;
              pFVar6[iVar21].m_n[1] = (this->m_nodes).m_data + (int)bVar40;
              pFVar6[iVar21].m_n[2] = (this->m_nodes).m_data + lVar17;
              pFVar6[lVar33 + -1].m_n[0] = (this->m_nodes).m_data + lVar17;
              pFVar6[lVar33 + -1].m_n[1] = (this->m_nodes).m_data + (int)bVar4;
              pFVar6[lVar33 + -1].m_n[2] = (this->m_nodes).m_data + (int)bVar5;
              pNVar7 = (this->m_nodes).m_data;
              appendLink(this,pNVar7 + lVar17,pNVar7 + (int)bVar5,
                         pFVar6[iVar21].super_Feature.m_material,false);
              iVar13 = (this->m_faces).m_size;
              goto LAB_001db293;
            }
          }
        }
        uVar34 = uVar32 + 1;
        uVar22 = uVar32;
      } while (uVar32 + 1 != 3);
      iVar21 = iVar21 + 1;
LAB_001db293:
    } while (iVar21 < iVar13);
  }
  if ((char)local_14c == '\0') goto LAB_001db8ce;
  local_188.m_ownsMemory = true;
  local_188.m_data = (int *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  uVar19 = (this->m_nodes).m_size;
  if ((int)uVar19 < 1) {
    local_188.m_capacity = 0;
    local_188.m_size = uVar19;
  }
  else {
    sVar35 = (ulong)uVar19 * 4;
    piVar15 = (int *)btAlignedAllocInternal(sVar35,0x10);
    local_188.m_capacity = uVar19;
    if ((long)local_188.m_size < 1) {
      if (local_188.m_data != (int *)0x0) goto LAB_001db30a;
      local_188.m_ownsMemory = true;
      local_188.m_data = piVar15;
      memset(piVar15,0,sVar35);
      local_188.m_size = uVar19;
    }
    else {
      lVar17 = 0;
      do {
        piVar15[lVar17] = local_188.m_data[lVar17];
        lVar17 = lVar17 + 1;
      } while (local_188.m_size != lVar17);
LAB_001db30a:
      if (local_188.m_ownsMemory == true) {
        btAlignedFreeInternal(local_188.m_data);
      }
      local_188.m_ownsMemory = true;
      local_188.m_data = piVar15;
      memset(piVar15,0,sVar35);
      local_188.m_size = uVar19;
      if ((int)uVar19 < 1) goto LAB_001db440;
    }
    lVar17 = 0;
    uVar34 = 0;
    do {
      pNVar16 = (this->m_nodes).m_data;
      local_e8[0].m_floats = *(btScalar (*) [4])((long)(pNVar16->m_x).m_floats + lVar17);
      if ((long)uVar34 < (long)(int)n) {
        fVar38 = (float)(**(code **)(*(long *)ifn + 0x10))();
        if (ABS(fVar38) < local_168) {
          pNVar16 = (this->m_nodes).m_data;
          goto LAB_001db3b2;
        }
      }
      else {
LAB_001db3b2:
        puVar1 = (undefined8 *)((long)(pNVar16->m_v).m_floats + lVar17);
        uVar2 = *puVar1;
        uVar3 = puVar1[1];
        local_148._0_4_ = SUB84(uVar2,0);
        local_148.m_size = (int)((ulong)uVar2 >> 0x20);
        local_148.m_capacity = (int)uVar3;
        local_148._12_4_ = SUB84((ulong)uVar3 >> 0x20,0);
        fVar38 = *(float *)((long)(&pNVar16->m_n + 1) + lVar17);
        bVar40 = (btScalar)(-(uint)(0.0 < fVar38) & (uint)(1.0 / fVar38));
        if (0.0 < bVar40) {
          bVar40 = bVar40 * 0.5;
          *(float *)((long)(&pNVar16->m_n + 1) + lVar17) = fVar38 + fVar38;
        }
        appendNode(this,local_e8,bVar40);
        iVar13 = (this->m_nodes).m_size;
        local_188.m_data[uVar34] = iVar13 + -1;
        pbVar25 = &(this->m_nodes).m_data[(long)iVar13 + -1].m_v;
        *(ulong *)pbVar25->m_floats = CONCAT44(local_148.m_size,local_148._0_4_);
        *(ulong *)(pbVar25->m_floats + 2) = CONCAT44(local_148._12_4_,local_148.m_capacity);
      }
      uVar34 = uVar34 + 1;
      lVar17 = lVar17 + 0x78;
    } while (uVar19 != uVar34);
  }
LAB_001db440:
  pNVar16 = (this->m_nodes).m_data;
  lVar17 = (long)(this->m_links).m_size;
  if (0 < lVar17) {
    lVar31 = 0;
    do {
      pLVar27 = (this->m_links).m_data;
      iVar13 = (int)lVar31;
      if ((local_188.m_data
           [(int)((ulong)((long)pLVar27[lVar31].m_n[0] - (long)pNVar16) >> 3) * -0x11111111] == 0)
         || (local_188.m_data
             [(int)((long)pLVar27[lVar31].m_n[1] - (long)pNVar16 >> 3) * -0x11111111] == 0)) {
        fVar38 = (float)(**(code **)(*(long *)ifn + 0x10))();
        if ((fVar38 < local_168) &&
           (fVar38 = (float)(**(code **)(*(long *)ifn + 0x10))(), fVar38 < local_168))
        goto LAB_001db518;
      }
      else {
        appendLink(this,iVar13,(Material *)0x0);
        iVar13 = (this->m_links).m_size + -1;
LAB_001db518:
        if (iVar13 != 0) {
          pLVar27 = (this->m_links).m_data;
          lVar33 = 0;
          bVar36 = true;
          do {
            bVar12 = bVar36;
            if ((long)local_188.m_data
                      [(int)((ulong)((long)pLVar27[iVar13].m_n[lVar33] - (long)pNVar16) >> 3) *
                       -0x11111111] != 0) {
              pLVar27[iVar13].m_n[lVar33] =
                   (this->m_nodes).m_data +
                   local_188.m_data
                   [(int)((ulong)((long)pLVar27[iVar13].m_n[lVar33] - (long)pNVar16) >> 3) *
                    -0x11111111];
            }
            lVar33 = 1;
            bVar36 = false;
          } while (bVar12);
        }
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != lVar17);
  }
  lVar17 = (long)(this->m_faces).m_size;
  if (0 < lVar17) {
    lVar33 = 0x10;
    lVar31 = 0;
    do {
      pFVar6 = (this->m_faces).m_data;
      fVar38 = (float)(**(code **)(*(long *)ifn + 0x10))();
      if (((fVar38 < local_168) &&
          (fVar38 = (float)(**(code **)(*(long *)ifn + 0x10))(), fVar38 < local_168)) &&
         (fVar38 = (float)(**(code **)(*(long *)ifn + 0x10))(), fVar38 < local_168)) {
        lVar20 = 0;
        do {
          if ((long)local_188.m_data
                    [(int)((ulong)(*(long *)((long)pFVar6->m_n + lVar20 * 8 + lVar33 + -0x10) -
                                  (long)pNVar16) >> 3) * -0x11111111] != 0) {
            *(Node **)((long)pFVar6->m_n + lVar20 * 8 + lVar33 + -0x10) =
                 (this->m_nodes).m_data +
                 local_188.m_data
                 [(int)((ulong)(*(long *)((long)pFVar6->m_n + lVar20 * 8 + lVar33 + -0x10) -
                               (long)pNVar16) >> 3) * -0x11111111];
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
      }
      lVar31 = lVar31 + 1;
      lVar33 = lVar33 + 0x48;
    } while (lVar31 != lVar17);
  }
  iVar13 = (this->m_nodes).m_size;
  piVar15 = (int *)0x0;
  local_148.m_ownsMemory = true;
  local_148.m_data = (int *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  local_68.m_ownsMemory = true;
  local_68.m_data = (int *)0x0;
  local_68.m_size = 0;
  local_68.m_capacity = 0;
  if (0 < (long)iVar13) {
    sVar35 = (long)iVar13 << 2;
    piVar15 = (int *)btAlignedAllocInternal(sVar35,0x10);
    if ((long)local_148.m_size < 1) {
      if (local_148.m_data != (int *)0x0) goto LAB_001db6ec;
    }
    else {
      lVar17 = 0;
      do {
        piVar15[lVar17] = local_148.m_data[lVar17];
        lVar17 = lVar17 + 1;
      } while (local_148.m_size != lVar17);
LAB_001db6ec:
      if (local_148.m_ownsMemory == true) {
        btAlignedFreeInternal(local_148.m_data);
      }
    }
    local_148.m_ownsMemory = true;
    local_148.m_capacity = iVar13;
    local_148.m_data = piVar15;
    memset(piVar15,0,sVar35);
  }
  lVar17 = (long)(this->m_links).m_size;
  if (0 < lVar17) {
    pLVar27 = (this->m_links).m_data;
    lVar31 = 0;
    do {
      lVar33 = 0;
      bVar36 = true;
      do {
        bVar12 = bVar36;
        piVar15[(int)((ulong)((long)pLVar27[lVar31].m_n[lVar33] - (long)pNVar16) >> 3) * -0x11111111
               ] = piVar15[(int)((ulong)((long)pLVar27[lVar31].m_n[lVar33] - (long)pNVar16) >> 3) *
                           -0x11111111] + 1;
        lVar33 = 1;
        bVar36 = false;
      } while (bVar12);
      lVar31 = lVar31 + 1;
    } while (lVar31 != lVar17);
  }
  lVar17 = (long)(this->m_faces).m_size;
  if (0 < lVar17) {
    ppNVar14 = ((this->m_faces).m_data)->m_n;
    lVar31 = 0;
    do {
      lVar33 = 0;
      do {
        piVar15[(int)((ulong)((long)ppNVar14[lVar33] - (long)pNVar16) >> 3) * -0x11111111] =
             piVar15[(int)((ulong)((long)ppNVar14[lVar33] - (long)pNVar16) >> 3) * -0x11111111] + 1;
        lVar33 = lVar33 + 1;
      } while (lVar33 != 3);
      lVar31 = lVar31 + 1;
      ppNVar14 = ppNVar14 + 9;
    } while (lVar31 != lVar17);
  }
  iVar21 = (this->m_links).m_size;
  if (0 < iVar21) {
    iVar23 = 0;
    do {
      pLVar27 = (this->m_links).m_data;
      iVar26 = (int)((ulong)((long)pLVar27[iVar23].m_n[0] - (long)pNVar16) >> 3) * -0x11111111;
      iVar30 = (int)((ulong)((long)pLVar27[iVar23].m_n[1] - (long)pNVar16) >> 3) * -0x11111111;
      if ((piVar15[iVar26] == 1) || (piVar15[iVar30] == 1)) {
        piVar15[iVar26] = piVar15[iVar26] + -1;
        piVar15[iVar30] = piVar15[iVar30] + -1;
        pLVar29 = pLVar27 + iVar23;
        iVar21 = (this->m_links).m_size;
        pLVar24 = pLVar29;
        pbVar25 = local_e8;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          *(void **)pbVar25->m_floats = (pLVar24->super_Feature).super_Element.m_tag;
          pLVar24 = (Link *)((long)pLVar24 + (ulong)bVar37 * -0x10 + 8);
          pbVar25 = (btVector3 *)((long)(pbVar25 + -(ulong)bVar37) + 8);
        }
        pLVar24 = pLVar27 + (long)iVar21 + -1;
        pLVar28 = pLVar29;
        for (lVar17 = 8; lVar17 != 0; lVar17 = lVar17 + -1) {
          (pLVar28->super_Feature).super_Element.m_tag =
               (pLVar24->super_Feature).super_Element.m_tag;
          pLVar24 = (Link *)((long)pLVar24 + (ulong)bVar37 * -0x10 + 8);
          pLVar28 = (Link *)((long)pLVar28 + (ulong)bVar37 * -0x10 + 8);
        }
        (pLVar29->m_c3).m_floats[3] = pLVar27[(long)iVar21 + -1].m_c3.m_floats[3];
        pbVar25 = local_e8;
        pLVar29 = pLVar27 + (long)iVar21 + -1;
        for (lVar17 = 8; lVar17 != 0; lVar17 = lVar17 + -1) {
          (pLVar29->super_Feature).super_Element.m_tag = *(void **)pbVar25->m_floats;
          pbVar25 = (btVector3 *)((long)(pbVar25 + -(ulong)bVar37) + 8);
          pLVar29 = (Link *)((long)pLVar29 + (ulong)bVar37 * -0x10 + 8);
        }
        pLVar27[(long)iVar21 + -1].m_c3.m_floats[3] = local_a8;
        iVar21 = (this->m_links).m_size + -1;
        (this->m_links).m_size = iVar21;
        iVar23 = iVar23 + -1;
      }
      iVar23 = iVar23 + 1;
    } while (iVar23 < iVar21);
  }
  local_148.m_size = iVar13;
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_68);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_148);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_188);
LAB_001db8ce:
  this->m_bUpdateRtCst = true;
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_a0.store);
  return;
}

Assistant:

void			btSoftBody::refine(ImplicitFn* ifn,btScalar accurary,bool cut)
{
	const Node*			nbase = &m_nodes[0];
	int					ncount = m_nodes.size();
	btSymMatrix<int>	edges(ncount,-2);
	int					newnodes=0;
	int i,j,k,ni;

	/* Filter out		*/ 
	for(i=0;i<m_links.size();++i)
	{
		Link&	l=m_links[i];
		if(l.m_bbending)
		{
			if(!SameSign(ifn->Eval(l.m_n[0]->m_x),ifn->Eval(l.m_n[1]->m_x)))
			{
				btSwap(m_links[i],m_links[m_links.size()-1]);
				m_links.pop_back();--i;
			}
		}	
	}
	/* Fill edges		*/ 
	for(i=0;i<m_links.size();++i)
	{
		Link&	l=m_links[i];
		edges(int(l.m_n[0]-nbase),int(l.m_n[1]-nbase))=-1;
	}
	for(i=0;i<m_faces.size();++i)
	{	
		Face&	f=m_faces[i];
		edges(int(f.m_n[0]-nbase),int(f.m_n[1]-nbase))=-1;
		edges(int(f.m_n[1]-nbase),int(f.m_n[2]-nbase))=-1;
		edges(int(f.m_n[2]-nbase),int(f.m_n[0]-nbase))=-1;
	}
	/* Intersect		*/ 
	for(i=0;i<ncount;++i)
	{
		for(j=i+1;j<ncount;++j)
		{
			if(edges(i,j)==-1)
			{
				Node&			a=m_nodes[i];
				Node&			b=m_nodes[j];
				const btScalar	t=ImplicitSolve(ifn,a.m_x,b.m_x,accurary);
				if(t>0)
				{
					const btVector3	x=Lerp(a.m_x,b.m_x,t);
					const btVector3	v=Lerp(a.m_v,b.m_v,t);
					btScalar		m=0;
					if(a.m_im>0)
					{
						if(b.m_im>0)
						{
							const btScalar	ma=1/a.m_im;
							const btScalar	mb=1/b.m_im;
							const btScalar	mc=Lerp(ma,mb,t);
							const btScalar	f=(ma+mb)/(ma+mb+mc);
							a.m_im=1/(ma*f);
							b.m_im=1/(mb*f);
							m=mc*f;
						}
						else
						{ a.m_im/=0.5f;m=1/a.m_im; }
					}
					else
					{
						if(b.m_im>0)
						{ b.m_im/=0.5f;m=1/b.m_im; }
						else
							m=0;
					}
					appendNode(x,m);
					edges(i,j)=m_nodes.size()-1;
					m_nodes[edges(i,j)].m_v=v;
					++newnodes;
				}
			}
		}
	}
	nbase=&m_nodes[0];
	/* Refine links		*/ 
	for(i=0,ni=m_links.size();i<ni;++i)
	{
		Link&		feat=m_links[i];
		const int	idx[]={	int(feat.m_n[0]-nbase),
			int(feat.m_n[1]-nbase)};
		if((idx[0]<ncount)&&(idx[1]<ncount))
		{
			const int ni=edges(idx[0],idx[1]);
			if(ni>0)
			{
				appendLink(i);
				Link*		pft[]={	&m_links[i],
					&m_links[m_links.size()-1]};			
				pft[0]->m_n[0]=&m_nodes[idx[0]];
				pft[0]->m_n[1]=&m_nodes[ni];
				pft[1]->m_n[0]=&m_nodes[ni];
				pft[1]->m_n[1]=&m_nodes[idx[1]];
			}
		}
	}
	/* Refine faces		*/ 
	for(i=0;i<m_faces.size();++i)
	{
		const Face&	feat=m_faces[i];
		const int	idx[]={	int(feat.m_n[0]-nbase),
			int(feat.m_n[1]-nbase),
			int(feat.m_n[2]-nbase)};
		for(j=2,k=0;k<3;j=k++)
		{
			if((idx[j]<ncount)&&(idx[k]<ncount))
			{
				const int ni=edges(idx[j],idx[k]);
				if(ni>0)
				{
					appendFace(i);
					const int	l=(k+1)%3;
					Face*		pft[]={	&m_faces[i],
						&m_faces[m_faces.size()-1]};
					pft[0]->m_n[0]=&m_nodes[idx[l]];
					pft[0]->m_n[1]=&m_nodes[idx[j]];
					pft[0]->m_n[2]=&m_nodes[ni];
					pft[1]->m_n[0]=&m_nodes[ni];
					pft[1]->m_n[1]=&m_nodes[idx[k]];
					pft[1]->m_n[2]=&m_nodes[idx[l]];
					appendLink(ni,idx[l],pft[0]->m_material);
					--i;break;
				}
			}
		}
	}
	/* Cut				*/ 
	if(cut)
	{	
		btAlignedObjectArray<int>	cnodes;
		const int					pcount=ncount;
		int							i;
		ncount=m_nodes.size();
		cnodes.resize(ncount,0);
		/* Nodes		*/ 
		for(i=0;i<ncount;++i)
		{
			const btVector3	x=m_nodes[i].m_x;
			if((i>=pcount)||(btFabs(ifn->Eval(x))<accurary))
			{
				const btVector3	v=m_nodes[i].m_v;
				btScalar		m=getMass(i);
				if(m>0) { m*=0.5f;m_nodes[i].m_im/=0.5f; }
				appendNode(x,m);
				cnodes[i]=m_nodes.size()-1;
				m_nodes[cnodes[i]].m_v=v;
			}
		}
		nbase=&m_nodes[0];
		/* Links		*/ 
		for(i=0,ni=m_links.size();i<ni;++i)
		{
			const int		id[]={	int(m_links[i].m_n[0]-nbase),
				int(m_links[i].m_n[1]-nbase)};
			int				todetach=0;
			if(cnodes[id[0]]&&cnodes[id[1]])
			{
				appendLink(i);
				todetach=m_links.size()-1;
			}
			else
			{
				if((	(ifn->Eval(m_nodes[id[0]].m_x)<accurary)&&
					(ifn->Eval(m_nodes[id[1]].m_x)<accurary)))
					todetach=i;
			}
			if(todetach)
			{
				Link&	l=m_links[todetach];
				for(int j=0;j<2;++j)
				{
					int cn=cnodes[int(l.m_n[j]-nbase)];
					if(cn) l.m_n[j]=&m_nodes[cn];
				}			
			}
		}
		/* Faces		*/ 
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			Node**			n=	m_faces[i].m_n;
			if(	(ifn->Eval(n[0]->m_x)<accurary)&&
				(ifn->Eval(n[1]->m_x)<accurary)&&
				(ifn->Eval(n[2]->m_x)<accurary))
			{
				for(int j=0;j<3;++j)
				{
					int cn=cnodes[int(n[j]-nbase)];
					if(cn) n[j]=&m_nodes[cn];
				}
			}
		}
		/* Clean orphans	*/ 
		int							nnodes=m_nodes.size();
		btAlignedObjectArray<int>	ranks;
		btAlignedObjectArray<int>	todelete;
		ranks.resize(nnodes,0);
		for(i=0,ni=m_links.size();i<ni;++i)
		{
			for(int j=0;j<2;++j) ranks[int(m_links[i].m_n[j]-nbase)]++;
		}
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			for(int j=0;j<3;++j) ranks[int(m_faces[i].m_n[j]-nbase)]++;
		}
		for(i=0;i<m_links.size();++i)
		{
			const int	id[]={	int(m_links[i].m_n[0]-nbase),
				int(m_links[i].m_n[1]-nbase)};
			const bool	sg[]={	ranks[id[0]]==1,
				ranks[id[1]]==1};
			if(sg[0]||sg[1])
			{
				--ranks[id[0]];
				--ranks[id[1]];
				btSwap(m_links[i],m_links[m_links.size()-1]);
				m_links.pop_back();--i;
			}
		}
#if 0	
		for(i=nnodes-1;i>=0;--i)
		{
			if(!ranks[i]) todelete.push_back(i);
		}	
		if(todelete.size())
		{		
			btAlignedObjectArray<int>&	map=ranks;
			for(int i=0;i<nnodes;++i) map[i]=i;
			PointersToIndices(this);
			for(int i=0,ni=todelete.size();i<ni;++i)
			{
				int		j=todelete[i];
				int&	a=map[j];
				int&	b=map[--nnodes];
				m_ndbvt.remove(m_nodes[a].m_leaf);m_nodes[a].m_leaf=0;
				btSwap(m_nodes[a],m_nodes[b]);
				j=a;a=b;b=j;			
			}
			IndicesToPointers(this,&map[0]);
			m_nodes.resize(nnodes);
		}
#endif
	}
	m_bUpdateRtCst=true;
}